

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O3

void av1_inv_txfm2d_add_64x64_c(int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  long lVar1;
  long lVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  long lVar5;
  int32_t mod_input [4096];
  int txfm_buf [4224];
  int32_t local_8260 [32];
  undefined8 local_81e0 [1008];
  undefined1 local_6260 [8192];
  int32_t local_4260 [4238];
  
  lVar5 = 0;
  do {
    lVar1 = lVar5 * 2;
    puVar3 = (undefined4 *)((long)input + lVar5);
    puVar4 = (undefined4 *)((long)local_8260 + lVar1);
    for (lVar2 = 0x20; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + 1;
      puVar4 = puVar4 + 1;
    }
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x70) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x78) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x60) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x68) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x50) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x58) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x40) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x48) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x30) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x38) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x20) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x28) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x10) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 0x18) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1) = 0;
    *(undefined8 *)((long)local_81e0 + lVar1 + 8) = 0;
    lVar5 = lVar5 + 0x80;
  } while (lVar5 != 0x1000);
  memset(local_6260,0,0x2000);
  inv_txfm2d_add_facade(local_8260,output,stride,local_4260,tx_type,'\x04',bd);
  return;
}

Assistant:

void av1_inv_txfm2d_add_64x64_c(const int32_t *input, uint16_t *output,
                                int stride, TX_TYPE tx_type, int bd) {
  // TODO(urvang): Can the same array be reused, instead of using a new array?
  // Remap 32x32 input into a modified 64x64 by:
  // - Copying over these values in top-left 32x32 locations.
  // - Setting the rest of the locations to 0.
  int32_t mod_input[64 * 64];
  for (int col = 0; col < 32; ++col) {
    memcpy(mod_input + col * 64, input + col * 32, 32 * sizeof(*mod_input));
    memset(mod_input + col * 64 + 32, 0, 32 * sizeof(*mod_input));
  }
  memset(mod_input + 32 * 64, 0, 32 * 64 * sizeof(*mod_input));
  DECLARE_ALIGNED(32, int, txfm_buf[64 * 64 + 64 + 64]);
  inv_txfm2d_add_facade(mod_input, output, stride, txfm_buf, tx_type, TX_64X64,
                        bd);
}